

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

bool capnp::compiler::anon_unknown_0::checkChange
               (Reader file1,Reader file2,ChangeKind changeKind,uint sharedOrdinalCount)

{
  bool bVar1;
  Exception *pEVar2;
  ExceptionCallback *pEVar3;
  Fault local_4a8;
  Fault f_1;
  ChangeKind *local_498;
  undefined1 local_490 [8];
  DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind_&,_capnp::compiler::(anonymous_namespace)::ChangeKind>
  _kjCondition_1;
  Fault f;
  undefined1 local_458 [8];
  DebugComparison<kj::Maybe<kj::Exception>_&,_const_kj::None_&> _kjCondition;
  Exception *e;
  Exception *_e740;
  undefined1 local_3e0 [8];
  Maybe<kj::Exception> exception;
  Maybe<kj::Exception> local_218;
  undefined1 local_80 [8];
  SchemaLoader loader;
  Own<capnp::MallocMessageBuilder,_std::nullptr_t> local_48;
  Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> local_38;
  undefined1 local_28 [8];
  Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> exampleBuilder;
  ChangeKind local_10;
  uint sharedOrdinalCount_local;
  ChangeKind changeKind_local;
  
  exampleBuilder.ptr.ptr._4_4_ = sharedOrdinalCount;
  local_10 = changeKind;
  kj::Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> *)local_28);
  if (local_10 != INCOMPATIBLE) {
    kj::heap<capnp::MallocMessageBuilder>();
    kj::Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_>::Maybe(&local_38,&local_48);
    kj::Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_>::operator=
              ((Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> *)local_28,&local_38);
    kj::Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_>::~Maybe(&local_38);
    kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>::~Own(&local_48);
  }
  SchemaLoader::SchemaLoader((SchemaLoader *)local_80);
  exception.ptr.field_1.value.details.builder.disposer = (ArrayDisposer *)file1._reader.segment;
  loadFile(&local_218,file1,(SchemaLoader *)local_80,true,
           (Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> *)local_28,
           exampleBuilder.ptr.ptr._4_4_);
  kj::Maybe<kj::Exception>::~Maybe(&local_218);
  loadFile((Maybe<kj::Exception> *)local_3e0,file2,(SchemaLoader *)local_80,false,
           (Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> *)local_28,
           exampleBuilder.ptr.ptr._4_4_);
  if (local_10 == COMPATIBLE) {
    pEVar2 = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_3e0);
    if (pEVar2 == (Exception *)0x0) {
      sharedOrdinalCount_local._3_1_ = 1;
    }
    else {
      pEVar3 = kj::getExceptionCallback();
      pEVar2 = kj::mv<kj::Exception>(pEVar2);
      (*pEVar3->_vptr_ExceptionCallback[3])(pEVar3,pEVar2);
      sharedOrdinalCount_local._3_1_ = 0;
    }
  }
  else if (local_10 == INCOMPATIBLE) {
    f.exception = (Exception *)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                             (Maybe<kj::Exception> *)local_3e0);
    kj::_::DebugExpression<kj::Maybe<kj::Exception>&>::operator!=
              ((DebugComparison<kj::Maybe<kj::Exception>_&,_const_kj::None_&> *)local_458,
               (DebugExpression<kj::Maybe<kj::Exception>&> *)&f,(None *)&kj::none);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_458);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Exception>&,kj::None_const&>&,capnp::compiler::ParsedFile::Reader&,capnp::compiler::ParsedFile::Reader&>
                ((Fault *)&_kjCondition_1.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2eb,FAILED,"exception != kj::none","_kjCondition,file1, file2",
                 (DebugComparison<kj::Maybe<kj::Exception>_&,_const_kj::None_&> *)local_458,&file1,
                 &file2);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
    }
    sharedOrdinalCount_local._3_1_ = 0;
  }
  else {
    local_498 = (ChangeKind *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_10);
    f_1.exception._4_4_ = 3;
    kj::_::DebugExpression<capnp::compiler::(anonymous_namespace)::ChangeKind&>::operator==
              ((DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind_&,_capnp::compiler::(anonymous_namespace)::ChangeKind>
                *)local_490,
               (DebugExpression<capnp::compiler::(anonymous_namespace)::ChangeKind&> *)&local_498,
               (ChangeKind *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_490);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind&,capnp::compiler::(anonymous_namespace)::ChangeKind>&>
                (&local_4a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2ee,FAILED,"changeKind == SUBTLY_COMPATIBLE","_kjCondition,",
                 (DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind_&,_capnp::compiler::(anonymous_namespace)::ChangeKind>
                  *)local_490);
      kj::_::Debug::Fault::fatal(&local_4a8);
    }
    sharedOrdinalCount_local._3_1_ = 1;
  }
  _kjCondition._36_4_ = 1;
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)local_3e0);
  SchemaLoader::~SchemaLoader((SchemaLoader *)local_80);
  kj::Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_>::~Maybe
            ((Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> *)local_28);
  return (bool)(sharedOrdinalCount_local._3_1_ & 1);
}

Assistant:

bool checkChange(ParsedFile::Reader file1, ParsedFile::Reader file2, ChangeKind changeKind,
                 uint sharedOrdinalCount) {
  // Try loading file1 followed by file2 into the same SchemaLoader, expecting it to behave
  // according to changeKind.  Returns true if the files are both expected to be compatible and
  // actually are -- the main loop uses this to decide which version to keep

  kj::Maybe<kj::Own<MallocMessageBuilder>> exampleBuilder;

  if (changeKind != INCOMPATIBLE) {
    // For COMPATIBLE and SUBTLY_COMPATIBLE changes, build an example message with one schema
    // and check it with the other.
    exampleBuilder = kj::heap<MallocMessageBuilder>();
  }

  SchemaLoader loader;
  loadFile(file1, loader, true, exampleBuilder, sharedOrdinalCount);
  auto exception = loadFile(file2, loader, false, exampleBuilder, sharedOrdinalCount);

  if (changeKind == COMPATIBLE) {
    KJ_IF_SOME(e, exception) {
      kj::getExceptionCallback().onFatalException(kj::mv(e));
      return false;
    } else {
      return true;
    }
  } else if (changeKind == INCOMPATIBLE) {
    KJ_ASSERT(exception != kj::none, file1, file2);
    return false;
  } else {
    KJ_ASSERT(changeKind == SUBTLY_COMPATIBLE);

    // SchemaLoader is allowed to throw an exception in this case, but we ignore it.
    return true;
  }
}